

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool map_load(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *pgVar1;
  gravity_value_t gVar2;
  gravity_value_t value_00;
  gravity_value_t value_01;
  gravity_value_t value_02;
  gravity_fiber_t *fiber;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar3;
  gravity_value_t *pgVar4;
  gravity_class_t *local_10a0;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 local_1098;
  gravity_value_t *value;
  gravity_closure_t *closure;
  gravity_object_t *obj;
  char local_1048 [8];
  char _buffer [4096];
  gravity_value_t key;
  gravity_map_t *map;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  pgVar1 = (args->field_1).p;
  pgVar4 = args + 1;
  gVar2 = *pgVar4;
  if (pgVar4->isa == (gravity_class_t *)0x0) {
    snprintf(local_1048,0x1000,"Invalid map key.");
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1048);
    value_02.field_1.n = 0;
    value_02.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_02,rindex);
    vm_local._7_1_ = false;
  }
  else {
    aVar3.p = gravity_class_lookup(gravity_class_map,*pgVar4);
    if (aVar3.n == 0) {
      pgVar4 = gravity_hash_lookup((gravity_hash_t *)pgVar1->objclass,gVar2);
      if (pgVar4 == (gravity_value_t *)0x0) {
        local_10a0 = gravity_class_null;
        local_1098.n = 0;
      }
      else {
        local_10a0 = pgVar4->isa;
        local_1098 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(pgVar4->field_1).n;
      }
      gVar2.field_1.n = local_1098.n;
      gVar2.isa = local_10a0;
      gravity_vm_setslot(vm,gVar2,rindex);
      vm_local._7_1_ = true;
    }
    else if (((((aVar3.p)->isa == gravity_class_closure) && (aVar3.n != 0)) &&
             ((aVar3.p)->identifier != (char *)0x0)) &&
            (((*(gravity_class_t **)(aVar3.p)->identifier == gravity_class_function &&
              (*(int *)((aVar3.p)->identifier + 0x48) == 3)) &&
             (*(long *)((aVar3.p)->identifier + 0x58) != 0)))) {
      value_01.field_1.n =
           ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((aVar3.p)->identifier + 0x58))->n;
      value_01.isa = (gravity_class_t *)**(undefined8 **)((aVar3.p)->identifier + 0x58);
      gravity_vm_setslot(vm,value_01,rindex);
      vm_local._7_1_ = false;
    }
    else {
      value_00.field_1.n = aVar3.n;
      value_00.isa = (aVar3.p)->isa;
      gravity_vm_setslot(vm,value_00,rindex);
      vm_local._7_1_ = true;
    }
  }
  return vm_local._7_1_;
}

Assistant:

static bool map_load (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)
    
    // called when a map is accessed with dot notation
    // for example:
    // var map = ["key1": 10];
    // return map.key1;
    // in this case (since we override object_load super) try to access
    // class first and if nothing is found access its internal hash table
    
    gravity_map_t *map = VALUE_AS_MAP(GET_VALUE(0));
    gravity_value_t key = GET_VALUE(1);
    if (VALUE_ISA_NOTVALID(key)) RETURN_ERROR("Invalid map key.");

    // check class first (so user will not be able to break anything)
    gravity_object_t *obj = (gravity_object_t *)gravity_class_lookup(gravity_class_map, key);
    if (obj) {
        if (OBJECT_ISA_CLOSURE(obj)) {
            gravity_closure_t *closure = (gravity_closure_t *)obj;
            if (closure && closure->f) {
                // execute optimized default getter
                if (FUNCTION_ISA_SPECIAL(closure->f)) {
                    if (FUNCTION_ISA_GETTER(closure->f)) {
                        // returns a function to be executed using the return false trick
                        RETURN_CLOSURE(VALUE_FROM_OBJECT((gravity_closure_t *)closure->f->special[EXEC_TYPE_SPECIAL_GETTER]), rindex);
                    }
                }
            }
        }
        RETURN_VALUE(VALUE_FROM_OBJECT(obj), rindex);
    }
    
    // then check its internal hash
    gravity_value_t *value = gravity_hash_lookup(map->hash, key);
    RETURN_VALUE((value) ? *value : VALUE_FROM_NULL, rindex);
}